

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select.hpp
# Opt level: O1

Shrinkable<int> __thiscall
rc::gen::detail::OneOfGen<int>::operator()(OneOfGen<int> *this,Random *random,int size)

{
  unsigned_long uVar1;
  Number NVar2;
  long lVar3;
  undefined4 in_register_00000014;
  unsigned_long *puVar4;
  Random *pRVar5;
  Random r;
  Random RStack_d8;
  Random local_80;
  
  puVar4 = (unsigned_long *)CONCAT44(in_register_00000014,size);
  pRVar5 = &local_80;
  for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pRVar5->m_key)._M_elems[0] = *puVar4;
    puVar4 = puVar4 + 1;
    pRVar5 = (Random *)((pRVar5->m_key)._M_elems + 1);
  }
  Random::split(&RStack_d8,&local_80);
  NVar2 = Random::next(&RStack_d8);
  uVar1 = (random->m_key)._M_elems[0];
  Gen<int>::operator()
            ((Gen<int> *)this,
             (Random *)
             (uVar1 + (NVar2 % (ulong)(((long)((random->m_key)._M_elems[1] - uVar1) >> 3) *
                                      -0x3333333333333333)) * 0x28),(int)&local_80);
  return (Shrinkable<int>)(IShrinkableImpl *)this;
}

Assistant:

Shrinkable<T> operator()(const Random &random, int size) const {
    Random r(random);
    const auto i = static_cast<std::size_t>(r.split().next() % m_gens.size());
    return m_gens[i](r, size);
  }